

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall cmGraphVizWriter::OnItem(cmGraphVizWriter *this,cmLinkItem *item)

{
  bool bVar1;
  string *__k;
  mapped_type *this_00;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  cmLinkItem *local_18;
  cmLinkItem *item_local;
  cmGraphVizWriter *this_local;
  
  local_18 = item;
  item_local = (cmLinkItem *)this;
  bVar1 = ItemExcluded(this,item);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_68,&this->GraphNodePrefix);
    cmAlphaNum::cmAlphaNum(&local_98,this->NextNodeId);
    cmStrCat<>(&local_38,&local_68,&local_98);
    __k = cmLinkItem::AsStr_abi_cxx11_(local_18);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->NodeNames,__k);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this->NextNodeId = this->NextNodeId + 1;
    WriteNode(this,&this->GlobalFileStream,local_18);
  }
  return;
}

Assistant:

void cmGraphVizWriter::OnItem(cmLinkItem const& item)
{
  if (this->ItemExcluded(item)) {
    return;
  }

  this->NodeNames[item.AsStr()] =
    cmStrCat(this->GraphNodePrefix, this->NextNodeId);
  ++this->NextNodeId;

  this->WriteNode(this->GlobalFileStream, item);
}